

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O0

int direction_lookup(char *dir)

{
  bool bVar1;
  char *in_RDI;
  int num;
  int local_c;
  
  bVar1 = str_cmp(in_RDI,"n");
  if ((bVar1) && (bVar1 = str_cmp(in_RDI,"north"), bVar1)) {
    bVar1 = str_cmp(in_RDI,"e");
    if ((bVar1) && (bVar1 = str_cmp(in_RDI,"east"), bVar1)) {
      bVar1 = str_cmp(in_RDI,"s");
      if ((bVar1) && (bVar1 = str_cmp(in_RDI,"south"), bVar1)) {
        bVar1 = str_cmp(in_RDI,"w");
        if ((bVar1) && (bVar1 = str_cmp(in_RDI,"west"), bVar1)) {
          bVar1 = str_cmp(in_RDI,"u");
          if ((bVar1) && (bVar1 = str_cmp(in_RDI,"up"), bVar1)) {
            bVar1 = str_cmp(in_RDI,"d");
            if ((bVar1) && (bVar1 = str_cmp(in_RDI,"down"), bVar1)) {
              local_c = -1;
            }
            else {
              local_c = 5;
            }
          }
          else {
            local_c = 4;
          }
        }
        else {
          local_c = 3;
        }
      }
      else {
        local_c = 2;
      }
    }
    else {
      local_c = 1;
    }
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

int direction_lookup(char *dir)
{
	int num;

	if (!str_cmp(dir, "n") || !str_cmp(dir, "north"))
		num = 0;
	else if (!str_cmp(dir, "e") || !str_cmp(dir, "east"))
		num = 1;
	else if (!str_cmp(dir, "s") || !str_cmp(dir, "south"))
		num = 2;
	else if (!str_cmp(dir, "w") || !str_cmp(dir, "west"))
		num = 3;
	else if (!str_cmp(dir, "u") || !str_cmp(dir, "up"))
		num = 4;
	else if (!str_cmp(dir, "d") || !str_cmp(dir, "down"))
		num = 5;
	else
		num = -1;

	return num;
}